

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_cbs_auth.c
# Opt level: O1

int authentication_stop(AUTHENTICATION_HANDLE authentication_handle)

{
  AUTHENTICATION_STATE AVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  if (authentication_handle == (AUTHENTICATION_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x197;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x197;
    }
    pcVar5 = "authentication_stop failed (authentication_handle is NULL)";
    iVar3 = 0x198;
  }
  else {
    AVar1 = authentication_handle->state;
    if (AVar1 != AUTHENTICATION_STATE_STOPPED) {
      authentication_handle->cbs_handle = (CBS_HANDLE)0x0;
      authentication_handle->state = AUTHENTICATION_STATE_STOPPED;
      if (authentication_handle->on_state_changed_callback !=
          (ON_AUTHENTICATION_STATE_CHANGED_CALLBACK)0x0) {
        (*authentication_handle->on_state_changed_callback)
                  (authentication_handle->on_state_changed_callback_context,AVar1,
                   AUTHENTICATION_STATE_STOPPED);
        return 0;
      }
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar4 = 0x1a0;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1a0;
    }
    pcVar5 = "authentication_stop failed (messenger is already stopped)";
    iVar3 = 0x1a1;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
            ,"authentication_stop",iVar3,1,pcVar5);
  return iVar4;
}

Assistant:

int authentication_stop(AUTHENTICATION_HANDLE authentication_handle)
{
    int result;

    if (authentication_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("authentication_stop failed (authentication_handle is NULL)");
    }
    else
    {
        AUTHENTICATION_INSTANCE* instance = (AUTHENTICATION_INSTANCE*)authentication_handle;

        if (instance->state == AUTHENTICATION_STATE_STOPPED)
        {
            result = MU_FAILURE;
            LogError("authentication_stop failed (messenger is already stopped)");
        }
        else
        {
            instance->cbs_handle = NULL;

            update_state(instance, AUTHENTICATION_STATE_STOPPED);

            result = RESULT_OK;
        }
    }

    return result;
}